

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall
CVmObjLookupTable::get_nth_ele
          (CVmObjLookupTable *this,vm_val_t *key,vm_val_t *val,vm_obj_id_t self,long idx)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  uint *puVar2;
  uint uVar3;
  bool bVar4;
  
  if (idx == 0) {
    if (key != (vm_val_t *)0x0) {
      key->typ = VM_NIL;
    }
    if (val == (vm_val_t *)0x0) {
      return;
    }
    puVar2 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
  }
  else {
    puVar2 = (uint *)(this->super_CVmObjCollection).super_CVmObject.ext_;
    uVar3 = puVar2[1];
    puVar2 = puVar2 + (ulong)*puVar2 * 2 + 8;
    while( true ) {
      bVar4 = uVar3 == 0;
      uVar3 = uVar3 - 1;
      if (bVar4) {
        err_throw(0x7df);
      }
      if ((*puVar2 != 0xd) && (idx = idx + -1, idx == 0)) break;
      puVar2 = puVar2 + 10;
    }
    if (key != (vm_val_t *)0x0) {
      uVar3 = puVar2[1];
      aVar1 = *(anon_union_8_8_cb74652f_for_val *)(puVar2 + 2);
      key->typ = puVar2[0];
      *(uint *)&key->field_0x4 = uVar3;
      key->val = aVar1;
    }
    if (val == (vm_val_t *)0x0) {
      return;
    }
  }
  uVar3 = puVar2[5];
  aVar1 = *(anon_union_8_8_cb74652f_for_val *)(puVar2 + 6);
  val->typ = puVar2[4];
  *(uint *)&val->field_0x4 = uVar3;
  val->val = aVar1;
  return;
}

Assistant:

void CVmObjLookupTable::get_nth_ele(VMG_ vm_val_t *key, vm_val_t *val,
                                    vm_obj_id_t self, long idx)
{
    uint i;
    vm_lookup_val *entry;

    /* 
     *   if the index is zero, and we're asking for the value, return the
     *   default value 
     */
    if (idx == 0)
    {
        if (key != 0)
            key->set_nil();
        if (val != 0)
            *val = get_ext()->default_value;
        return;
    }
    
    /* iterate over our buckets */
    for (i = get_entry_count(), entry = get_ext()->idx_to_val(0) ;
         i != 0 ; --i, ++entry)
    {
        /* if it's in use (i.e., the key isn't empty), count it */
        if (entry->key.typ != VM_EMPTY)
        {
            /* count it */
            --idx;

            /* if this is the one we're looking for, return it */
            if (idx == 0)
            {
                /* fill in the key and/or value elements */
                if (key != 0)
                    *key = entry->key;
                if (val != 0)
                    *val = entry->val;

                /* done */
                return;
            }
        }
    }

    /* we didn't find it - the index is out of range */
    err_throw(VMERR_INDEX_OUT_OF_RANGE);
}